

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O2

void __thiscall
mir::inst::Variable::Variable
          (Variable *this,SharedTyPtr *ty,bool is_memory_var,bool is_temp_var,bool is_phi_var)

{
  (this->super_Displayable)._vptr_Displayable = (_func_int **)&PTR_display_001daf78;
  std::__shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>,
             &ty->super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>);
  this->is_memory_var = is_memory_var;
  this->is_temp_var = is_temp_var;
  this->is_phi_var = is_phi_var;
  this->priority = 0;
  return;
}

Assistant:

Variable(types::SharedTyPtr ty, bool is_memory_var = false,
           bool is_temp_var = false, bool is_phi_var = false)
      : ty(ty),
        is_memory_var(is_memory_var),
        is_temp_var(is_temp_var),
        is_phi_var(is_phi_var) {}